

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

CPAccessResult access_tvm_trvm(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,_Bool isread)

{
  int iVar1;
  ulong uVar2;
  uint64_t uVar3;
  uint64_t trap;
  _Bool isread_local;
  ARMCPRegInfo_conflict *ri_local;
  CPUARMState_conflict *env_local;
  
  iVar1 = arm_current_el(env);
  if (iVar1 == 1) {
    uVar2 = 0x4000000;
    if (isread) {
      uVar2 = 0x40000000;
    }
    uVar3 = arm_hcr_el2_eff_aarch64(env);
    if ((uVar3 & uVar2) != 0) {
      return CP_ACCESS_TRAP_EL2;
    }
  }
  return CP_ACCESS_OK;
}

Assistant:

static CPAccessResult access_tvm_trvm(CPUARMState *env, const ARMCPRegInfo *ri,
                                      bool isread)
{
    if (arm_current_el(env) == 1) {
        uint64_t trap = isread ? HCR_TRVM : HCR_TVM;
        if (arm_hcr_el2_eff(env) & trap) {
            return CP_ACCESS_TRAP_EL2;
        }
    }
    return CP_ACCESS_OK;
}